

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Vector3fi * __thiscall pbrt::Transform::operator()(Transform *this,Vector3fi *v)

{
  undefined1 auVar1 [16];
  bool bVar2;
  float *pfVar3;
  Vector3fi *in_RDI;
  span<const_float> *psVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar15 [56];
  undefined1 auVar14 [64];
  Vector3f VVar16;
  Float zp;
  Float yp;
  Float xp;
  Vector3f vInError;
  Vector3f vOutError;
  Float z;
  Float y;
  Float x;
  float in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  float fVar17;
  undefined4 in_stack_fffffffffffffc94;
  float fVar18;
  undefined4 in_stack_fffffffffffffcb0;
  float in_stack_fffffffffffffcb4;
  span<const_float> local_2a0;
  span<const_float> local_290;
  span<const_float> local_280;
  undefined4 local_26c;
  span<const_float> local_268;
  span<const_float> local_258;
  span<const_float> local_248;
  undefined4 local_234;
  span<const_float> local_230;
  span<const_float> local_220;
  span<const_float> local_210;
  undefined4 local_1fc;
  span<const_float> local_1f8;
  span<const_float> local_1e8;
  span<const_float> local_1d8;
  span<const_float> local_1c8;
  span<const_float> local_1b8;
  span<const_float> local_1a8;
  span<const_float> local_198;
  span<const_float> local_188;
  span<const_float> local_178;
  span<const_float> local_168;
  span<const_float> local_158;
  span<const_float> local_148;
  span<const_float> local_138;
  span<const_float> local_128;
  span<const_float> local_118;
  span<const_float> local_108;
  span<const_float> local_f8;
  span<const_float> local_e8;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c4;
  float local_bc;
  span<const_float> local_b8;
  span<const_float> local_a8;
  span<const_float> local_98;
  span<const_float> local_88;
  span<const_float> local_78;
  span<const_float> local_68;
  span<const_float> local_58;
  span<const_float> local_48;
  span<const_float> local_38;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  undefined1 extraout_var [60];
  
  local_14 = Interval::operator_cast_to_float((Interval<float> *)0x7ebe34);
  local_18 = Interval::operator_cast_to_float((Interval<float> *)0x7ebe4e);
  auVar13._0_4_ = Interval::operator_cast_to_float((Interval<float> *)0x7ebe68);
  auVar13._4_60_ = extraout_var;
  local_1c = auVar13._0_4_;
  Vector3<float>::Vector3((Vector3<float> *)0x7ebe7e);
  bVar2 = Vector3fi::IsExact((Vector3fi *)
                             CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  auVar15 = auVar13._8_56_;
  if (bVar2) {
    dVar10 = pbrt::gamma(auVar13._0_8_);
    local_38 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_38;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_48 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_48;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_58 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_58;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar7 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    local_28 = SUB84(dVar10,0) * (fVar5 + fVar6 + fVar7);
    dVar10 = pbrt::gamma((double)(ulong)(uint)local_28);
    local_68 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_68;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_78 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_78;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_88 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_88;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar7 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    local_24 = SUB84(dVar10,0) * (fVar5 + fVar6 + fVar7);
    dVar10 = pbrt::gamma((double)(ulong)(uint)local_24);
    local_98 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_98;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_a8 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_a8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_b8 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_b8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar7 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    local_20 = SUB84(dVar10,0) * (fVar5 + fVar6 + fVar7);
  }
  else {
    VVar16 = Vector3fi::Error((Vector3fi *)
                              CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    local_d0 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar14._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar14._8_56_ = auVar15;
    local_d8 = vmovlpd_avx(auVar14._0_16_);
    local_c4 = local_d8;
    local_bc = local_d0;
    dVar10 = pbrt::gamma(auVar14._0_8_);
    local_e8 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_e8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    in_stack_fffffffffffffcb4 = *pfVar3;
    std::abs((int)psVar4);
    uVar8 = (uint)local_c4;
    local_f8 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_f8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar5 = *pfVar3;
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416(uVar8),ZEXT416((uint)in_stack_fffffffffffffcb4),
                             ZEXT416((uint)(fVar5 * local_c4._4_4_)));
    local_108 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_108;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    auVar12 = ZEXT416((uint)*pfVar3);
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_bc),auVar12,ZEXT416(auVar1._0_4_));
    dVar11 = pbrt::gamma(auVar1._0_8_);
    local_118 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_118;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_128 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_128;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_138 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_138;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar7 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416(auVar1._0_4_),ZEXT416((uint)(SUB84(dVar10,0) + 1.0)),
                             ZEXT416((uint)(SUB84(dVar11,0) * (fVar5 + fVar6 + fVar7))));
    local_28 = auVar1._0_4_;
    dVar10 = pbrt::gamma(auVar1._0_8_);
    local_148 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_148;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3;
    std::abs((int)psVar4);
    uVar8 = (uint)local_c4;
    local_158 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_158;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3;
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416(uVar8),ZEXT416((uint)fVar5),
                             ZEXT416((uint)(fVar6 * local_c4._4_4_)));
    local_168 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_168;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    auVar12 = ZEXT416((uint)*pfVar3);
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_bc),auVar12,ZEXT416(auVar1._0_4_));
    dVar11 = pbrt::gamma(auVar1._0_8_);
    local_178 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_178;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_188 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_188;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_198 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_198;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar7 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416(auVar1._0_4_),ZEXT416((uint)(SUB84(dVar10,0) + 1.0)),
                             ZEXT416((uint)(SUB84(dVar11,0) * (fVar5 + fVar6 + fVar7))));
    local_24 = auVar1._0_4_;
    dVar10 = pbrt::gamma(auVar1._0_8_);
    local_1a8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_1a8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3;
    std::abs((int)psVar4);
    uVar8 = (uint)local_c4;
    local_1b8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_1b8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3;
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416(uVar8),ZEXT416((uint)fVar5),
                             ZEXT416((uint)(fVar6 * local_c4._4_4_)));
    local_1c8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_1c8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    auVar12 = ZEXT416((uint)*pfVar3);
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_bc),auVar12,ZEXT416(auVar1._0_4_));
    dVar11 = pbrt::gamma(auVar1._0_8_);
    local_1d8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_1d8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_1e8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_1e8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_1f8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                           (int)in_stack_fffffffffffffc8c);
    psVar4 = &local_1f8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar7 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    auVar1 = vfmadd213ss_fma(ZEXT416(auVar1._0_4_),ZEXT416((uint)(SUB84(dVar10,0) + 1.0)),
                             ZEXT416((uint)(SUB84(dVar11,0) * (fVar5 + fVar6 + fVar7))));
    local_20 = auVar1._0_4_;
  }
  local_210 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                         (int)in_stack_fffffffffffffc8c);
  pfVar3 = pstd::span<const_float>::operator[](&local_210,0);
  fVar5 = *pfVar3;
  fVar17 = local_14;
  local_220 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(fVar5,local_14),(int)in_stack_fffffffffffffc8c)
  ;
  pfVar3 = pstd::span<const_float>::operator[](&local_220,1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(*pfVar3 * local_18)));
  local_230 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(fVar5,fVar17),(int)in_stack_fffffffffffffc8c);
  pfVar3 = pstd::span<const_float>::operator[](&local_230,2);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_1c),ZEXT416((uint)*pfVar3),ZEXT416(auVar1._0_4_));
  local_1fc = auVar1._0_4_;
  local_248 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(fVar5,fVar17),(int)in_stack_fffffffffffffc8c);
  pfVar3 = pstd::span<const_float>::operator[](&local_248,0);
  fVar7 = local_14;
  fVar6 = *pfVar3;
  local_258 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(fVar5,fVar17),(int)in_stack_fffffffffffffc8c);
  pfVar3 = pstd::span<const_float>::operator[](&local_258,1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar6),
                           ZEXT416((uint)(*pfVar3 * local_18)));
  uVar8 = auVar1._0_4_;
  local_268 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(fVar5,fVar17),(int)in_stack_fffffffffffffc8c);
  pfVar3 = pstd::span<const_float>::operator[](&local_268,2);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_1c),ZEXT416((uint)*pfVar3),ZEXT416(uVar8));
  local_234 = auVar1._0_4_;
  local_280 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(fVar5,fVar17),(int)in_stack_fffffffffffffc8c);
  pfVar3 = pstd::span<const_float>::operator[](&local_280,0);
  fVar7 = *pfVar3;
  fVar18 = local_14;
  local_290 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(fVar5,fVar17),(int)in_stack_fffffffffffffc8c);
  pfVar3 = pstd::span<const_float>::operator[](&local_290,1);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416((uint)fVar7),
                           ZEXT416((uint)(*pfVar3 * local_18)));
  uVar9 = auVar1._0_4_;
  local_2a0 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(fVar5,fVar17),(int)in_stack_fffffffffffffc8c);
  pfVar3 = pstd::span<const_float>::operator[](&local_2a0,2);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_1c),ZEXT416((uint)*pfVar3),ZEXT416(uVar9));
  local_26c = auVar1._0_4_;
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(fVar5,fVar17),in_stack_fffffffffffffc8c,
             in_stack_fffffffffffffc88,0.0);
  Vector3fi::Vector3fi
            ((Vector3fi *)CONCAT44(in_stack_fffffffffffffcb4,uVar9),
             (Vector3f *)CONCAT44(fVar7,fVar18),(Vector3f *)CONCAT44(uVar8,fVar6));
  return in_RDI;
}

Assistant:

inline Vector3fi Transform::operator()(const Vector3fi &v) const {
    Float x = Float(v.x), y = Float(v.y), z = Float(v.z);
    Vector3f vOutError;
    if (v.IsExact()) {
        vOutError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    } else {
        Vector3f vInError = v.Error();
        vOutError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * vInError.x +
                                        std::abs(m[0][1]) * vInError.y +
                                        std::abs(m[0][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * vInError.x +
                                        std::abs(m[1][1]) * vInError.y +
                                        std::abs(m[1][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * vInError.x +
                                        std::abs(m[2][1]) * vInError.y +
                                        std::abs(m[2][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    }

    Float xp = m[0][0] * x + m[0][1] * y + m[0][2] * z;
    Float yp = m[1][0] * x + m[1][1] * y + m[1][2] * z;
    Float zp = m[2][0] * x + m[2][1] * y + m[2][2] * z;

    return Vector3fi(Vector3f(xp, yp, zp), vOutError);
}